

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O0

string * __thiscall
boost::runtime::
value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::interpret(value_interpreter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            *this,cstring *param_2,cstring *source)

{
  iterator pvVar1;
  size_type sVar2;
  basic_cstring<const_char> *in_RCX;
  string *in_RDI;
  allocator local_21 [33];
  
  pvVar1 = unit_test::basic_cstring<const_char>::begin(in_RCX);
  sVar2 = unit_test::basic_cstring<const_char>::size(in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pvVar1,sVar2,local_21);
  std::allocator<char>::~allocator((allocator<char> *)local_21);
  return in_RDI;
}

Assistant:

std::string interpret( cstring, cstring source ) const
    {
        return std::string( source.begin(), source.size() );
    }